

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaK_exp2nextreg(FuncState *fs,expdesc *e)

{
  uint uVar1;
  int reg;
  
  luaK_dischargevars(fs,e);
  if (((e->k == VNONRELOC) && (uVar1 = (e->u).s.info, (uVar1 >> 8 & 1) == 0)) &&
     ((int)(uint)fs->nactvar <= (int)uVar1)) {
    fs->freereg = fs->freereg + -1;
  }
  luaK_checkstack(fs,1);
  reg = fs->freereg;
  fs->freereg = reg + 1;
  exp2reg(fs,e,reg);
  return;
}

Assistant:

static void luaK_exp2nextreg(FuncState*fs,expdesc*e){
luaK_dischargevars(fs,e);
freeexp(fs,e);
luaK_reserveregs(fs,1);
exp2reg(fs,e,fs->freereg-1);
}